

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O3

void __thiscall TPZGeoMesh::Write(TPZGeoMesh *this,TPZStream *buf,int withclassid)

{
  TPZCompMesh *pTVar1;
  _Base_ptr p_Var2;
  TPZSavable *obj;
  _Rb_tree_header *p_Var3;
  int64_t ninterfacemaps;
  undefined8 local_40;
  undefined4 local_38;
  size_t local_30;
  
  (*buf->_vptr_TPZStream[0xc])(buf,&this->fName,1);
  pTVar1 = this->fReference;
  if (pTVar1 == (TPZCompMesh *)0x0) {
    obj = (TPZSavable *)0x0;
  }
  else {
    obj = (TPZSavable *)
          ((long)(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fVec.fExtAlloc +
          *(long *)(*(long *)pTVar1 + -0x60) + -0x70);
  }
  TPZPersistenceManager::WritePointer(obj,buf);
  TPZStream::WritePointers<TPZGeoEl,10>(buf,&this->fElementVec);
  TPZAdmChunkVector<TPZGeoNode,_10>::Write(&this->fNodeVec,buf,withclassid);
  (*buf->_vptr_TPZStream[5])(buf,&this->fNodeMaxId,1);
  (*buf->_vptr_TPZStream[5])(buf,&this->fElementMaxId,1);
  (*buf->_vptr_TPZStream[3])(buf,&this->fDim,1);
  local_30 = (this->fInterfaceMaterials)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (*buf->_vptr_TPZStream[5])(buf,&local_30,1);
  p_Var2 = (this->fInterfaceMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->fInterfaceMaterials)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      local_38 = *(undefined4 *)&p_Var2[1]._M_parent;
      local_40 = *(undefined8 *)(p_Var2 + 1);
      (*buf->_vptr_TPZStream[3])(buf,&local_40,3);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void TPZGeoMesh::Write(TPZStream &buf, int withclassid) const { //ok
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        LOGPZ_DEBUG(logger, __PRETTY_FUNCTION__);
    }
#endif
    buf.Write(&fName);
//    if (fReference) {
//        std::cout << __PRETTY_FUNCTION__ << "TPZGeoMesh::Write Trying to write a gmesh with non-null reference. Call ResetReference() and try again." << std::endl;
//        std::cout.flush();
//        DebugStop();
//    }
    TPZPersistenceManager::WritePointer(fReference, &buf);
    buf.WritePointers(fElementVec);
    fNodeVec.Write(buf, withclassid);
    buf.Write(&fNodeMaxId);
    buf.Write(&fElementMaxId);
    buf.Write(&fDim);
    int64_t ninterfacemaps = fInterfaceMaterials.size();
    buf.Write(&ninterfacemaps);
    for (auto elem : fInterfaceMaterials) {
        int vals[3];
        vals[0] = elem.first.first;
        vals[1] = elem.first.second;
        vals[2] = elem.second;
        buf.Write(vals, 3);
    }
}